

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O0

PixelColor color_from_gradient(Gradient *gradient,float pos)

{
  bool bVar1;
  PixelColor PVar2;
  reference left;
  reference right;
  PixelColor local_54;
  __normal_iterator<const_GradientColor_*,_std::vector<GradientColor,_std::allocator<GradientColor>_>_>
  local_50;
  float *local_48;
  GradientColor *local_40;
  GradientColor *local_38;
  __normal_iterator<const_GradientColor_*,_std::vector<GradientColor,_std::allocator<GradientColor>_>_>
  local_30;
  __normal_iterator<const_GradientColor_*,_std::vector<GradientColor,_std::allocator<GradientColor>_>_>
  it;
  const_iterator end;
  float pos_local;
  Gradient *gradient_local;
  
  end._M_current._4_4_ = pos;
  it._M_current =
       (GradientColor *)
       std::vector<GradientColor,_std::allocator<GradientColor>_>::cend(&gradient->colors);
  local_38 = (GradientColor *)
             std::vector<GradientColor,_std::allocator<GradientColor>_>::cbegin(&gradient->colors);
  local_40 = it._M_current;
  local_48 = (float *)((long)&end._M_current + 4);
  local_30 = std::
             adjacent_find<__gnu_cxx::__normal_iterator<GradientColor_const*,std::vector<GradientColor,std::allocator<GradientColor>>>,color_from_gradient(Gradient_const&,float)::__0>
                       ((__normal_iterator<const_GradientColor_*,_std::vector<GradientColor,_std::allocator<GradientColor>_>_>
                         )local_38,it,(anon_class_8_1_ba1d6db4_for__M_comp)local_48);
  bVar1 = __gnu_cxx::
          operator==<const_GradientColor_*,_std::vector<GradientColor,_std::allocator<GradientColor>_>_>
                    (&local_30,&it);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    gradient_local._5_2_ = 0;
    gradient_local._7_1_ = '\0';
  }
  else {
    left = __gnu_cxx::
           __normal_iterator<const_GradientColor_*,_std::vector<GradientColor,_std::allocator<GradientColor>_>_>
           ::operator*(&local_30);
    local_50 = __gnu_cxx::
               __normal_iterator<const_GradientColor_*,_std::vector<GradientColor,_std::allocator<GradientColor>_>_>
               ::operator+(&local_30,1);
    right = __gnu_cxx::
            __normal_iterator<const_GradientColor_*,_std::vector<GradientColor,_std::allocator<GradientColor>_>_>
            ::operator*(&local_50);
    PVar2 = color_from_gradient_range(left,right,end._M_current._4_4_);
    gradient_local._5_2_ = PVar2._0_2_;
    gradient_local._7_1_ = PVar2.b;
  }
  local_54.b = gradient_local._7_1_;
  local_54.r = gradient_local._5_1_;
  local_54.g = gradient_local._6_1_;
  return local_54;
}

Assistant:

PixelColor color_from_gradient(const Gradient& gradient, const float pos) noexcept
{
    const auto end = gradient.colors.cend();

    const auto it = std::adjacent_find(gradient.colors.cbegin(), end,
        [&](const GradientColor& left, const GradientColor& right) { return left.pos <= pos && pos <= right.pos; });

    if (it != end)
        return color_from_gradient_range(*it, *(it + 1), pos);
    else
        return PixelColor{0, 0, 0};
}